

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O0

int32 __thiscall TTD::TextFormatReader::ReadNakedInt32(TextFormatReader *this,bool readSeparator)

{
  ParseTokenKind PVar1;
  char16_t *buff;
  int64 iVar2;
  undefined8 in_RDX;
  int64 ival;
  ParseTokenKind tok;
  bool readSeparator_local;
  TextFormatReader *this_local;
  
  (*(this->super_FileReader)._vptr_FileReader[2])(this,(ulong)readSeparator,in_RDX,readSeparator);
  PVar1 = Scan(this,&this->m_charListOpt);
  if (PVar1 != Number) {
    TTDAbort_unrecoverable_error("Error in parse.");
  }
  buff = JsUtil::ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>::GetBuffer
                   (&(this->m_charListOpt).
                     super_ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>);
  iVar2 = ReadIntFromCharArray(this,buff);
  if ((-0x80000001 < iVar2) && (iVar2 < 0x80000000)) {
    return (int32)iVar2;
  }
  TTDAbort_unrecoverable_error("Error in parse.");
}

Assistant:

int32 TextFormatReader::ReadNakedInt32(bool readSeparator)
    {
        this->ReadSeparator(readSeparator);

        NSTokens::ParseTokenKind tok = this->Scan(this->m_charListOpt);
        TTDAssert(tok == NSTokens::ParseTokenKind::Number, "Error in parse.");

        int64 ival = this->ReadIntFromCharArray(this->m_charListOpt.GetBuffer());
        TTDAssert(INT32_MIN <= ival && ival <= INT32_MAX, "Error in parse.");

        return (int32)ival;
    }